

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_older_than.c
# Opt level: O2

void test_option_older_than(void)

{
  int iVar1;
  wchar_t wVar2;
  stat_conflict st;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                     ,L'&',"test1in",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'\'',"test1in");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                     ,L'(',"a",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                     ,L')',"a/b",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'*',"old.txt",L'Ƥ',L'\xffffffff',"old.txt");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'+',"a/b/old.txt",L'Ƥ',L'\xffffffff',"old file in old directory");
  iVar1 = stat("old.txt",(stat *)&st);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L',',0,"0",(long)iVar1,"stat(\"old.txt\", &st)",(void *)0x0);
  sleepUntilAfter(st.st_mtim.tv_sec);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'.',"middle.txt",L'Ƥ',L'\xffffffff',"middle.txt");
  iVar1 = stat("middle.txt",(stat *)&st);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'/',0,"0",(long)iVar1,"stat(\"middle.txt\", &st)",(void *)0x0);
  sleepUntilAfter(st.st_mtim.tv_sec);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'1',"new.txt",L'Ƥ',L'\xffffffff',"new");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'2',"a/b/new.txt",L'Ƥ',L'\xffffffff',"new file in old directory");
  wVar2 = systemf("%s --format pax -cf ../test1.tar --older-than middle.txt *.txt a",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'8',0,"0",(long)wVar2,
                      "systemf(\"%s --format pax -cf ../test1.tar \" \"--older-than middle.txt *.txt a\", testprog)"
                      ,(void *)0x0);
  wVar2 = systemf("%s --format pax -cf ../test2.tar *.txt a",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L';',0,"0",(long)wVar2,
                      "systemf(\"%s --format pax -cf ../test2.tar *.txt a\", testprog)",(void *)0x0)
  ;
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'<',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                     ,L'?',"test1out",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'@',"test1out");
  wVar2 = systemf("%s xf ../test1.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'A',0,"0",(long)wVar2,"systemf(\"%s xf ../test1.tar\", testprog)",
                      (void *)0x0);
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'B',"new.txt");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'C',"a/b/new.txt");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'D',"middle.txt");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'E',"old.txt");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'F',"a/b/old.txt");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'G',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                     ,L'J',"test2out",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'K',"test2out");
  wVar2 = systemf("%s xf ../test2.tar --older-than ../test1in/middle.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                      ,L'N',0,"0",(long)wVar2,
                      "systemf(\"%s xf ../test2.tar --older-than ../test1in/middle.txt\", testprog)"
                      ,(void *)0x0);
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'O',"new.txt");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'P',"a/b/new.txt");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'Q',"middle.txt");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'R',"old.txt");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
             ,L'S',"a/b/old.txt");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_older_than.c"
                  ,L'T',"..");
  return;
}

Assistant:

DEFINE_TEST(test_option_older_than)
{
	struct stat st;

	/*
	 * Basic test of --older-than.
	 * First, create three files with different mtimes.
	 * Create test1.tar with --older-than, test2.tar without.
	 */
	assertMakeDir("test1in", 0755);
	assertChdir("test1in");
	assertMakeDir("a", 0755);
	assertMakeDir("a/b", 0755);
	assertMakeFile("old.txt", 0644, "old.txt");
	assertMakeFile("a/b/old.txt", 0644, "old file in old directory");
	assertEqualInt(0, stat("old.txt", &st));
	sleepUntilAfter(st.st_mtime);
	assertMakeFile("middle.txt", 0644, "middle.txt");
	assertEqualInt(0, stat("middle.txt", &st));
	sleepUntilAfter(st.st_mtime);
	assertMakeFile("new.txt", 0644, "new");
	assertMakeFile("a/b/new.txt", 0644, "new file in old directory");

	/* Test --older-than on create */
	assertEqualInt(0,
		systemf("%s --format pax -cf ../test1.tar "
			"--older-than middle.txt *.txt a",
			testprog));
	assertEqualInt(0,
		systemf("%s --format pax -cf ../test2.tar *.txt a",
			testprog));
	assertChdir("..");

	/* Extract test1.tar to a clean dir and verify what got archived. */
	assertMakeDir("test1out", 0755);
	assertChdir("test1out");
	assertEqualInt(0, systemf("%s xf ../test1.tar", testprog));
	assertFileNotExists("new.txt");
	assertFileNotExists("a/b/new.txt");
	assertFileNotExists("middle.txt");
	assertFileExists("old.txt");
	assertFileExists("a/b/old.txt");
	assertChdir("..");

	/* Extract test2.tar to a clean dir with --older-than and verify. */
	assertMakeDir("test2out", 0755);
	assertChdir("test2out");
	assertEqualInt(0,
		systemf("%s xf ../test2.tar --older-than ../test1in/middle.txt",
			testprog));
	assertFileNotExists("new.txt");
	assertFileNotExists("a/b/new.txt");
	assertFileNotExists("middle.txt");
	assertFileExists("old.txt");
	assertFileExists("a/b/old.txt");
	assertChdir("..");
}